

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O2

void WjTestLib_FreeTests(void)

{
  WjtlGroupList *pWVar1;
  WjtlTestList *pWVar2;
  WjtlGroupList *__ptr;
  WjtlTestList *__ptr_00;
  
  __ptr = gGroupListHead;
  while (__ptr != (WjtlGroupList *)0x0) {
    pWVar1 = __ptr->Next;
    __ptr_00 = __ptr->TestListHead;
    while (__ptr_00 != (WjtlTestList *)0x0) {
      pWVar2 = __ptr_00->Next;
      free(__ptr_00->TestName);
      free(__ptr_00);
      __ptr_00 = pWVar2;
    }
    __ptr->TestListHead = (WjtlTestList *)0x0;
    __ptr->TestListTail = (WjtlTestList *)0x0;
    free(__ptr->GroupName);
    free(__ptr);
    __ptr = pWVar1;
  }
  gGroupListHead = (WjtlGroupList *)0x0;
  gGroupListTail = (WjtlGroupList *)0x0;
  return;
}

Assistant:

void
    WjTestLib_FreeTests
    (
        void
    )
{
    WjtlGroupList* nextGroup = NULL;
    for( WjtlGroupList* group=gGroupListHead; group!=NULL; group=nextGroup )
    {
        nextGroup = group->Next;

        WjtlTestList* nextTest = NULL;
        for( WjtlTestList* test=group->TestListHead; test!=NULL; test=nextTest )
        {
            nextTest = test->Next;

            free( test->TestName );
            test->TestName = NULL;
            free( test );
            test = NULL;
        }

        group->TestListHead = NULL;
        group->TestListTail = NULL;

        free( group->GroupName );
        group->GroupName = NULL;
        free( group );
        group = NULL;
    }

    gGroupListHead = NULL;
    gGroupListTail = NULL;
}